

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

string * EthUdpPort::IP_String_abi_cxx11_(uint32_t IPaddr)

{
  string *in_RDI;
  char IPstr [16];
  undefined1 local_2c [4];
  char local_28 [24];
  
  inet_ntop(2,local_2c,local_28,0x10);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_28);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string EthUdpPort::IP_String(uint32_t IPaddr)
{
    char IPstr[INET_ADDRSTRLEN];
#ifdef _MSC_VER
    // Windows does not provide inet_ntop prior to Vista, so we use inet_ntoa.
    strncpy(IPstr, inet_ntoa(*reinterpret_cast<const struct in_addr *>(&IPaddr)), INET_ADDRSTRLEN);
#else
    inet_ntop(AF_INET, reinterpret_cast<const struct in_addr *>(&IPaddr), IPstr, INET_ADDRSTRLEN);
#endif
    return std::string(IPstr);
}